

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_draw_text<unsigned_char,unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,char *text,uchar *foreground_color,
          uchar *background_color,float opacity,CImgList<unsigned_char> *font,bool is_native_font)

{
  uchar value;
  CImg<unsigned_char> *pCVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  CImgArgumentException *this_00;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  char *pcVar10;
  uint c;
  ulong uVar11;
  int iVar12;
  CImg<unsigned_char> letter;
  CImg<unsigned_char> local_50;
  
  if (text != (char *)0x0) {
    if (font->_data == (CImg<unsigned_char> *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar10 = "non-";
      if (this->_is_shared != false) {
        pcVar10 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_text(): Empty specified font.",
                 (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum
                 ,this->_data,pcVar10,"unsigned char");
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    sVar4 = strlen(text);
    bVar2 = is_empty(this);
    if (bVar2) {
      uVar7 = 1;
      pCVar1 = font->_data;
      iVar5 = 0;
      iVar6 = 0;
      iVar12 = 0;
      bVar9 = 0;
      for (uVar8 = 0; (sVar4 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
        bVar9 = text[uVar8];
        if (bVar9 == 9) {
          uVar3 = pCVar1[0x20]._width * 4;
LAB_0010e3b6:
          iVar5 = iVar5 + uVar3;
        }
        else if (bVar9 == 10) {
          iVar6 = iVar6 + pCVar1->_height;
          if (iVar12 < iVar5) {
            iVar12 = iVar5;
          }
          iVar5 = 0;
        }
        else if ((uint)bVar9 < font->_width) {
          uVar3 = pCVar1[bVar9]._width;
          goto LAB_0010e3b6;
        }
      }
      if ((iVar5 != 0) || (bVar9 == 10)) {
        if (iVar12 < iVar5) {
          iVar12 = iVar5;
        }
        iVar6 = iVar6 + pCVar1->_height;
      }
      if (!is_native_font) {
        uVar7 = pCVar1->_spectrum;
      }
      assign(this,iVar12 + x0,iVar6 + y0,1,uVar7,'\0');
    }
    iVar12 = x0;
    for (uVar8 = 0; uVar8 != (sVar4 & 0xffffffff); uVar8 = uVar8 + 1) {
      bVar9 = text[uVar8];
      if (bVar9 == 9) {
        iVar12 = iVar12 + font->_data[0x20]._width * 4;
      }
      else if (bVar9 == 10) {
        y0 = y0 + font->_data->_height;
        iVar12 = x0;
      }
      else if ((uint)bVar9 < font->_width) {
        CImg(&letter,font->_data + bVar9);
        if (letter._data != (uchar *)0x0) {
          uVar7 = this->_spectrum;
          if (letter._spectrum < uVar7 && is_native_font) {
            resize(&letter,-100,-100,1,uVar7,0,2,0.0,0.0,0.0,0.0);
            uVar7 = this->_spectrum;
          }
          uVar3 = letter._spectrum;
          if (uVar7 < letter._spectrum) {
            uVar3 = uVar7;
          }
          if (foreground_color != (uchar *)0x0) {
            for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
              value = foreground_color[uVar11];
              if (value != '\x01') {
                get_shared_channel(&local_50,&letter,(uint)uVar11);
                operator*=(&local_50,value);
                ~CImg(&local_50);
              }
            }
          }
          if ((int)(bVar9 | 0x100) < (int)font->_width) {
            if (background_color != (uchar *)0x0) {
              for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                draw_rectangle(this,iVar12,y0,0,(int)uVar11,letter._width + iVar12 + -1,
                               letter._height + y0 + -1,0,(int)uVar11,background_color[uVar11],
                               opacity);
              }
            }
            draw_image<unsigned_char,unsigned_char>
                      (this,iVar12,y0,&letter,
                       (CImg<unsigned_char> *)
                       ((long)&font->_data->_width + (ulong)((bVar9 | 0x100) << 5)),opacity,255.0);
          }
          else {
            draw_image<unsigned_char>(this,iVar12,y0,&letter,opacity);
          }
          iVar12 = iVar12 + letter._width;
        }
        ~CImg(&letter);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& _draw_text(const int x0, const int y0,
                        const char *const text,
                        const tc1 *const foreground_color, const tc2 *const background_color,
                        const float opacity, const CImgList<t>& font,
                        const bool is_native_font) {
      if (!text) return *this;
      if (!font)
        throw CImgArgumentException(_cimg_instance
                                    "draw_text(): Empty specified font.",
                                    cimg_instance);

      const unsigned int text_length = (unsigned int)std::strlen(text);
      const bool _is_empty = is_empty();
      if (_is_empty) {
        // If needed, pre-compute necessary size of the image
        int x = 0, y = 0, w = 0;
        unsigned char c = 0;
        for (unsigned int i = 0; i<text_length; ++i) {
          c = text[i];
          switch (c) {
          case '\n' : y+=font[0]._height; if (x>w) w = x; x = 0; break;
          case '\t' : x+=4*font[' ']._width; break;
          default : if (c<font._width) x+=font[c]._width;
          }
        }
        if (x!=0 || c=='\n') {
          if (x>w) w=x;
          y+=font[0]._height;
        }
        assign(x0+w,y0+y,1,is_native_font?1:font[0]._spectrum,0);
      }

      int x = x0, y = y0;
      for (unsigned int i = 0; i<text_length; ++i) {
        const unsigned char c = text[i];
        switch (c) {
        case '\n' : y+=font[0]._height; x = x0; break;
        case '\t' : x+=4*font[' ']._width; break;
        default : if (c<font._width) {
            CImg<T> letter = font[c];
            if (letter) {
              if (is_native_font && _spectrum>letter._spectrum) letter.resize(-100,-100,1,_spectrum,0,2);
              const unsigned int cmin = cimg::min(_spectrum,letter._spectrum);
              if (foreground_color) for (unsigned int c = 0; c<cmin; ++c) if (foreground_color[c]!=1) letter.get_shared_channel(c)*=foreground_color[c];
              if (c+256<font.width()) { // Letter has mask.
                if (background_color) for (unsigned int c = 0; c<cmin; ++c) draw_rectangle(x,y,0,c,x+letter._width-1,y+letter._height-1,0,c,background_color[c],opacity);
                draw_image(x,y,letter,font[c+256],opacity,(T)255);
              } else draw_image(x,y,letter,opacity); // Letter has no mask.
              x+=letter._width;
            }
          }
        }
      }
      return *this;
    }